

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<16U,_13U,_buffer_layout_bfs>::operator()
          (fill<16U,_13U,_buffer_layout_bfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  size_t sVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  array<unsigned_long,_16UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_16UL> *streams_local;
  fill<16U,_13U,_buffer_layout_bfs> *this_local;
  long local_38;
  size_t n_1;
  size_t n;
  size_t empty;
  
  pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xd);
  if (*pvVar6 != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 16U, I = 13U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
  sVar1 = pvVar7->n;
  pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
  if (sVar1 + pvVar7->n < 8) {
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
    sVar1 = pvVar7->n;
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
    lVar8 = (8 - sVar1) - pvVar7->n;
    n_1 = 8;
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
    sVar1 = n_1;
    if (pvVar7->n == 0) {
LAB_0015bf2d:
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x140 - n_1));
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xd);
      *pvVar6 = 8 - lVar8;
    }
    else {
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      if (pvVar7->n != 0) {
        do {
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            buffer[lVar8 + (0x140 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) goto LAB_0015bf2d;
          }
          else {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            buffer[lVar8 + (0x140 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) break;
          }
          n_1 = n_1 - 1;
        } while( true );
      }
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x140 - n_1));
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xd);
      *pvVar6 = 8 - lVar8;
      check_input(buffer + lVar8 + 0x138,8 - lVar8);
    }
  }
  else {
    local_38 = 8;
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
    lVar8 = local_38;
    if (pvVar7->n == 0) {
LAB_0015c2a7:
      local_38 = lVar8;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,pvVar7->stream + local_38,buffer + (0x140 - local_38));
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      pvVar7->n = pvVar7->n - local_38;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      pvVar7->stream = pvVar7->stream + local_38;
      pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xd);
      *pvVar6 = 8;
      check_input(buffer + 0x138,8);
    }
    else {
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
      if (pvVar7->n == 0) {
LAB_0015c387:
        local_38 = lVar8;
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
        ppuVar4 = pvVar7->stream;
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
        std::copy<unsigned_char**,unsigned_char**>
                  (ppuVar4,pvVar7->stream + local_38,buffer + (0x140 - local_38));
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
        pvVar7->n = pvVar7->n - local_38;
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
        pvVar7->stream = pvVar7->stream + local_38;
        pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xd);
        *pvVar6 = 8;
        check_input(buffer + 0x138,8);
      }
      else {
        for (; local_38 != 0; local_38 = local_38 + -1) {
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            buffer[0x140 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,10);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0015c2a7;
          }
          else {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            buffer[0x140 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,0xb);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0015c387;
          }
        }
        pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xd);
        *pvVar6 = 8;
        check_input(buffer + 0x138,8);
      }
    }
  }
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}